

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall
IR::Instr::ConvertToBailOutInstr
          (Instr *this,BailOutInfo *bailOutInfo,BailOutKind kind,bool useAuxBailOut)

{
  IRKind IVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  BailOutInstrTemplate<IR::BranchInstr> *this_00;
  BranchInstr *this_01;
  ProfiledInstr *pPVar8;
  ProfiledInstr *pPVar9;
  
  bVar5 = this->field_0x38;
  if ((bVar5 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb5,"(!this->HasBailOutInfo())","!this->HasBailOutInfo()");
    if (!bVar4) goto LAB_00484544;
    *puVar7 = 0;
    bVar5 = this->field_0x38;
  }
  if (((bVar5 & 0x40) >> 6 & useAuxBailOut) == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xcb7,"(!useAuxBailOut || !this->HasAuxBailOut())","Already aux bail out!");
    if (!bVar4) goto LAB_00484544;
    *puVar7 = 0;
    bVar5 = this->field_0x38;
  }
  if ((bVar5 & 0x40) != 0) {
    BVar6 = GetAuxBailOutKind(this);
    if (BVar6 == BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xcb8,
                         "(!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid)"
                         ,
                         "!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid"
                        );
      if (!bVar4) goto LAB_00484544;
      *puVar7 = 0;
    }
  }
  if ((this->field_0x38 & 0x40) == 0) {
    IVar1 = this->m_kind;
    if (IVar1 == InstrKindProfiled) {
      this_00 = (BailOutInstrTemplate<IR::BranchInstr> *)
                BailOutInstrTemplate<IR::ProfiledInstr>::New
                          (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
      pPVar8 = AsProfiledInstr(this);
      pPVar9 = AsProfiledInstr((Instr *)this_00);
      pPVar9->u = pPVar8->u;
    }
    else if (IVar1 == InstrKindBranch) {
      this_01 = AsBranchInstr(this);
      bVar4 = BranchInstr::IsMultiBranch(this_01);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0xcdf,"(!branchInstr->IsMultiBranch())","!branchInstr->IsMultiBranch()")
        ;
        if (!bVar4) goto LAB_00484544;
        *puVar7 = 0;
      }
      this_00 = BailOutInstrTemplate<IR::BranchInstr>::New
                          (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
      BranchInstr::SetTarget(&this_00->super_BranchInstr,this_01->m_branchTarget);
      (this_00->super_BranchInstr).m_byteCodeReg = this_01->m_byteCodeReg;
    }
    else {
      if (IVar1 != InstrKindInstr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        Js::Throw::ReportAssert
                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                   ,0xce7,"(false)","false");
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      this_00 = (BailOutInstrTemplate<IR::BranchInstr> *)
                BailOutInstrTemplate<IR::Instr>::New
                          (this->m_opcode,kind,bailOutInfo,bailOutInfo->bailOutFunc);
    }
    this->m_next->m_prev = (Instr *)this_00;
    pIVar2 = this->m_prev;
    pIVar2->m_next = (Instr *)this_00;
    (this_00->super_BranchInstr).super_Instr.m_next = this->m_next;
    (this_00->super_BranchInstr).super_Instr.m_prev = pIVar2;
    TransferTo(this,(Instr *)this_00);
    Free(this);
    this = (Instr *)this_00;
  }
  else {
    BVar6 = GetAuxBailOutKind(this);
    if ((BVar6 & ~(BailOutIgnoreException|BailOutForceByFlag)) != BailOutInvalid) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xcc2,
                         "((this->GetAuxBailOutKind() & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0)"
                         ,"Only IR::BailOutIgnoreException|ForceByFlag supported here.");
      if (!bVar4) {
LAB_00484544:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    SetBailOutKind_NoAssert(this,kind);
    ReplaceBailOutInfo(this,bailOutInfo);
    bailOutInfo->bailOutInstr = this;
    this->field_0x38 = this->field_0x38 | 0x10;
  }
  if (useAuxBailOut) {
    SetAuxBailOutKind(this,kind);
    SetBailOutKind_NoAssert(this,BailOutInvalid);
    (((BailOutInstrTemplate<IR::BranchInstr> *)this)->super_BranchInstr).super_Instr.field_0x38 =
         (((BailOutInstrTemplate<IR::BranchInstr> *)this)->super_BranchInstr).super_Instr.field_0x38
         & 0xaf | 0x40;
  }
  return (Instr *)(BailOutInstrTemplate<IR::BranchInstr> *)this;
}

Assistant:

IR::Instr *
Instr::ConvertToBailOutInstr(BailOutInfo * bailOutInfo, IR::BailOutKind kind, bool useAuxBailOut /* = false */)
{
    Assert(!this->HasBailOutInfo());

    AssertMsg(!useAuxBailOut || !this->HasAuxBailOut(), "Already aux bail out!");
    Assert(!this->HasAuxBailOut() || this->GetAuxBailOutKind() != IR::BailOutInvalid);

    IR::Instr * bailOutInstr = nullptr;
    if (this->HasAuxBailOut())
    {
        // This instr has already been converted to bailout instr. Only possible with aux bail out.
        // Typical scenario is when globopt calls to convert to e.g. BailOutOnImplicitCalls for the instr which
        // was already converted to bail out instr with HasBailOutInfo() == false and HasAuxBailOutInfo() == true,
        // so that aux bail out is hidden in between IRBuilder and lowerer.

        AssertMsg((this->GetAuxBailOutKind() & ~(IR::BailOutIgnoreException | IR::BailOutForceByFlag)) == 0, "Only IR::BailOutIgnoreException|ForceByFlag supported here.");
        // What we rely on here is:
        // - bailout doesn't have any args.
        // - bailout doesn't use offset as we get it from DebuggingFlags at time of bailout.

        // Use prev debugger bailout kind as decoration, while keeping new kind as main.
        this->SetBailOutKind_NoAssert(kind);

        // Clear old (aux) info and set to the new bailOutInfo.
        this->ReplaceBailOutInfo(bailOutInfo);
        bailOutInfo->bailOutInstr = this;
        this->hasBailOutInfo = true;

        bailOutInstr = this;
    }
    else
    {
        switch (this->m_kind)
        {
        case InstrKindInstr:
            bailOutInstr = IR::BailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            break;
        case InstrKindProfiled:
            bailOutInstr = IR::ProfiledBailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            bailOutInstr->AsProfiledInstr()->u = this->AsProfiledInstr()->u;
            break;
        case InstrKindBranch:
        {
            IR::BranchInstr * branchInstr = this->AsBranchInstr();
            Assert(!branchInstr->IsMultiBranch());
            IR::BranchBailOutInstr * branchBailOutInstr = IR::BranchBailOutInstr::New(this->m_opcode, kind, bailOutInfo, bailOutInfo->bailOutFunc);
            branchBailOutInstr->SetTarget(branchInstr->GetTarget());
            branchBailOutInstr->SetByteCodeReg(branchInstr->GetByteCodeReg());
            bailOutInstr = branchBailOutInstr;
            break;
        }
        default:
            AnalysisAssert(false);
        };

        this->m_next->m_prev = bailOutInstr;
        this->m_prev->m_next = bailOutInstr;
        bailOutInstr->m_next = this->m_next;
        bailOutInstr->m_prev = this->m_prev;

        this->TransferTo(bailOutInstr);

        this->Free();
    }

    if (useAuxBailOut)
    {
        // Move bail out kind from bailOutKind to auxBailOutKind and hide bailOutInfo as if this is not a bail out instr.
        bailOutInstr->SetAuxBailOutKind(kind);
        bailOutInstr->SetBailOutKind_NoAssert(IR::BailOutInvalid);
        bailOutInstr->hasBailOutInfo = false;
        bailOutInstr->hasAuxBailOut = true;
    }

    return bailOutInstr;
}